

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O0

wchar_t borg_attack_aux_launch(void)

{
  int iVar1;
  borg_item_conflict *pbVar2;
  _Bool _Var3;
  wchar_t wVar4;
  borg_item_conflict *item_00;
  char *what;
  int iVar5;
  borg_item *item;
  borg_item *bow;
  wchar_t b_v;
  wchar_t v;
  wchar_t d;
  wchar_t b_k;
  wchar_t k;
  wchar_t b_n;
  wchar_t n;
  
  pbVar2 = borg_items;
  b_k = L'\0';
  v = L'\xffffffff';
  bow._0_4_ = -1;
  iVar5 = z_info->pack_size + 1;
  if (borg_items[iVar5].iqty == '\0') {
    b_n = L'\0';
  }
  else if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
    d = (uint)z_info->pack_size + L'\f';
    while ((d < (int)(z_info->pack_size + 0xc + (uint)z_info->quiver_size) &&
           (item_00 = borg_items + d, item_00->iqty != '\0'))) {
      if (((uint)item_00->tval == borg.trait[0x98]) && (0 < item_00->value)) {
        b_v = (((uint)item_00->dd * (item_00->ds + 1)) / 2 + (int)item_00->to_d +
              (int)pbVar2[iVar5].to_d) * borg.trait[0x9a] * borg.trait[0x94];
        iVar1 = item_00->value;
        _Var3 = borg_item_note_needs_id(item_00);
        if (_Var3) {
          b_v = b_v * 99;
        }
        if ((L'\0' < b_v) &&
           (((wVar4 = borg_launch_bolt(L'\0',b_v,L'\x01',borg.trait[0x9a] * 2 + L'\x06',d),
             wVar4 != b_k || (iVar1 < (int)bow)) && (b_k <= wVar4)))) {
          v = d;
          bow._0_4_ = iVar1;
          b_k = wVar4;
        }
      }
      d = d + L'\x01';
    }
    if (b_k < L'\0') {
      b_n = L'\0';
    }
    else if ((borg_simulate & 1U) == 0) {
      what = format("# Firing missile \'%s\'",borg_items + v);
      borg_note(what);
      borg_keypress(0x66);
      borg_keypress((v - (z_info->pack_size + 0xc)) + 0x30);
      borg_keypress(0x35);
      successful_target = L'\xfffffffe';
      b_n = b_k;
    }
    else {
      b_n = b_k;
    }
  }
  else {
    b_n = L'\0';
  }
  return b_n;
}

Assistant:

int borg_attack_aux_launch(void)
{
    int n, b_n = 0;

    int k, b_k = -1;
    int d = -1;
    int v, b_v = -1;

    borg_item *bow = &borg_items[INVEN_BOW];

    /* skip if we don't have a bow */
    if (bow->iqty == 0)
        return 0;

    /* No firing while blind, confused, or hallucinating */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE])
        return 0;

    /* Scan the quiver */
    for (k = QUIVER_START; k < QUIVER_END; k++) {

        borg_item *item = &borg_items[k];

        /* Skip empty items */
        if (!item->iqty)
            break;

        /* Skip missiles that don't match the bow */
        if (item->tval != borg.trait[BI_AMMO_TVAL])
            continue;

        /* Skip worthless missiles */
        if (item->value <= 0)
            continue;

        /* Determine average damage */
        d = (item->dd * (item->ds + 1) / 2);
        d = d + item->to_d + bow->to_d;
        d = d * borg.trait[BI_AMMO_POWER] * borg.trait[BI_SHOTS];

        v = item->value;

        /* Boost the perceived damage on unID'd ones so he can get a quick
         * pseudoID on it */
        if (borg_item_note_needs_id(item))
            d = d * 99;

        /* Paranoia */
        if (d <= 0)
            continue;

        /* Choose optimal target of bolt */
        n = borg_launch_bolt(
            0, d, BORG_ATTACK_ARROW, 6 + 2 * borg.trait[BI_AMMO_POWER], k);

        /* if two attacks are equal, pick the cheaper ammo */
        if (n == b_n && v >= b_v)
            continue;

        if (n >= b_n) {
            b_n = n;
            b_v = v;
            b_k = k;
        }
    }

    /* Nothing to use */
    if (b_n < 0)
        return 0;

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Do it */
    borg_note(format("# Firing missile '%s'", borg_items[b_k].desc));

    /* Fire */
    borg_keypress('f');

    /* Use the missile from the quiver */
    borg_keypress(((b_k - QUIVER_START) + '0'));

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -2;

    /* Value */
    return b_n;
}